

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle_p_p.h
# Opt level: O2

QColor __thiscall QFusionStylePrivate::highlightedOutline(QFusionStylePrivate *this,QPalette *pal)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  QColor QVar3;
  undefined1 auVar4 [16];
  undefined8 local_38;
  undefined4 local_30;
  undefined2 local_2c;
  undefined8 local_28;
  undefined4 local_20;
  undefined2 uStack_1c;
  undefined2 uStack_1a;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_1c = 0xaaaa;
  uStack_1a = 0xaaaa;
  QVar3 = highlight(this,pal);
  local_38 = QVar3._0_8_;
  local_30 = QVar3.ct._4_4_;
  local_2c = QVar3.ct._8_2_;
  auVar4 = QColor::darker((int)&local_38);
  local_28 = auVar4._0_8_;
  local_20 = auVar4._8_4_;
  uStack_1c = auVar4._12_2_;
  iVar1 = QColor::value();
  if (0xa0 < iVar1) {
    iVar1 = QColor::hue();
    iVar2 = QColor::saturation();
    QColor::setHsl((int)&local_28,iVar1,iVar2,0xa0);
  }
  QVar3.ct._4_4_ = local_20;
  QVar3._0_8_ = local_28;
  QVar3.ct.argb.pad = uStack_1c;
  QVar3._14_2_ = uStack_1a;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QColor highlightedOutline(const QPalette &pal) const {
        QColor highlightedOutline = highlight(pal).darker(125);
        if (highlightedOutline.value() > 160)
            highlightedOutline.setHsl(highlightedOutline.hue(), highlightedOutline.saturation(), 160);
        return highlightedOutline;
    }